

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjTypeSpecFldInfo.cpp
# Opt level: O1

FixedFieldInfo * __thiscall
ObjTypeSpecFldInfo::GetFixedFieldIfAvailableAsFixedFunction(ObjTypeSpecFldInfo *this)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  FixedFieldIDL *pFVar5;
  
  if (((this->m_data).flags & 0x100) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                       ,0x13f,"(HasFixedValue())","HasFixedValue()");
    if (!bVar3) goto LAB_00615a9e;
    *puVar4 = 0;
  }
  uVar1._0_2_ = (this->m_data).flags;
  uVar1._2_2_ = (this->m_data).slotIndex;
  if ((~uVar1 & 0x1002) == 0) {
    pFVar5 = (FixedFieldIDL *)0x0;
  }
  else {
    if ((this->m_data).fixedFieldInfoArraySize == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                         ,0x144,"(m_data.fixedFieldInfoArraySize > 0)",
                         "m_data.fixedFieldInfoArraySize > 0");
      if (!bVar3) goto LAB_00615a9e;
      *puVar4 = 0;
    }
    if ((this->m_data).fixedFieldInfoArray.ptr == (FixedFieldIDL *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                         ,0x145,"(GetFixedFieldInfoArray())","GetFixedFieldInfoArray()");
      if (!bVar3) {
LAB_00615a9e:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    pFVar5 = (FixedFieldIDL *)
             FixedFieldInfo::GetFuncInfoAddr
                       ((FixedFieldInfo *)(this->m_data).fixedFieldInfoArray.ptr);
    if (pFVar5 != (FixedFieldIDL *)0x0) {
      pFVar5 = (this->m_data).fixedFieldInfoArray.ptr;
    }
  }
  return (FixedFieldInfo *)pFVar5;
}

Assistant:

FixedFieldInfo *
ObjTypeSpecFldInfo::GetFixedFieldIfAvailableAsFixedFunction()
{
    Assert(HasFixedValue());
    if (!IsMono() && !(IsPoly() && !DoesntHaveEquivalence()))
    {
        return nullptr;
    }
    AssertOrFailFast(m_data.fixedFieldInfoArraySize > 0);
    Assert(GetFixedFieldInfoArray());
    if (GetFixedFieldInfoArray()[0].GetFuncInfoAddr() != 0)
    {
        return &GetFixedFieldInfoArray()[0];
    }
    return nullptr;
}